

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_m2vd_vdpu1.c
# Opt level: O0

MPP_RET hal_m2vd_vdpu1_init_hwcfg(M2vdHalCtx *ctx)

{
  void *__s;
  M2vdVdpu1Reg_t *p_regs;
  M2vdHalCtx *ctx_local;
  
  __s = ctx->regs;
  memset(__s,0,0x194);
  *(uint *)((long)__s + 8) = *(uint *)((long)__s + 8) & 0xffffff;
  *(uint *)((long)__s + 8) = *(uint *)((long)__s + 8) & 0xff7fffff | 0x800000;
  *(uint *)((long)__s + 8) = *(uint *)((long)__s + 8) & 0xffbfffff | 0x400000;
  *(uint *)((long)__s + 8) = *(uint *)((long)__s + 8) & 0xffdfffff | 0x200000;
  *(uint *)((long)__s + 8) = *(uint *)((long)__s + 8) & 0xffefffff | 0x100000;
  *(uint *)((long)__s + 8) = *(uint *)((long)__s + 8) & 0xfff7ffff | 0x80000;
  *(uint *)((long)__s + 8) = *(uint *)((long)__s + 8) & 0xfffffbff | 0x400;
  *(uint *)((long)__s + 8) = *(uint *)((long)__s + 8) & 0xfffffdff | 0x200;
  *(uint *)((long)__s + 8) = *(uint *)((long)__s + 8) & 0xfffffeff | 0x100;
  *(uint *)((long)__s + 8) = *(uint *)((long)__s + 8) & 0xfffdffff;
  *(uint *)((long)__s + 8) = *(uint *)((long)__s + 8) & 0xffffffe0 | 0x10;
  *(uint *)((long)__s + 8) = *(uint *)((long)__s + 8) & 0xffffffdf;
  *(uint *)((long)__s + 8) = *(uint *)((long)__s + 8) & 0xffffffbf;
  *(uint *)((long)__s + 0xdc) = *(uint *)((long)__s + 0xdc) & 0xffffc000 | 8;
  *(uint *)((long)__s + 8) = *(uint *)((long)__s + 8) & 0xfffe07ff;
  *(uint *)((long)__s + 8) = *(uint *)((long)__s + 8) & 0xfffbffff;
  *(uint *)((long)__s + 4) = *(uint *)((long)__s + 4) & 0xfffffeff;
  *(uint *)((long)__s + 8) = *(uint *)((long)__s + 8) & 0xffffff;
  *(uint *)((long)__s + 0xc) = *(uint *)((long)__s + 0xc) & 0xffffff00;
  *(uint *)((long)__s + 0xc) = *(uint *)((long)__s + 0xc) & 0xfffffff | 0x80000000;
  return MPP_OK;
}

Assistant:

static MPP_RET hal_m2vd_vdpu1_init_hwcfg(M2vdHalCtx *ctx)
{
    M2vdVdpu1Reg_t *p_regs = (M2vdVdpu1Reg_t *)ctx->regs;

    memset(p_regs, 0, sizeof(M2vdVdpu1Reg_t));
    p_regs->sw02.dec_axi_rn_id = 0;
    p_regs->sw02.dec_timeout_e = 1;
    p_regs->sw02.dec_strswap32_e = 1;
    p_regs->sw02.dec_strendian_e = 1;
    p_regs->sw02.dec_inswap32_e = 1;
    p_regs->sw02.dec_outswap32_e = 1;

    p_regs->sw02.dec_clk_gate_e = 1;
    p_regs->sw02.dec_in_endian = 1;
    p_regs->sw02.dec_out_endian = 1;

    p_regs->sw02.dec_out_tiled_e = 0;
    p_regs->sw02.dec_max_burst = DEC_BUS_BURST_LENGTH_16;
    p_regs->sw02.dec_scmd_dis = 0;
    p_regs->sw02.dec_adv_pre_dis = 0;
    p_regs->sw55.apf_threshold = 8;
    p_regs->sw02.dec_latency = 0;
    p_regs->sw02.dec_data_disc_e = 0;
    p_regs->sw01.dec_irq = 0;
    p_regs->sw02.dec_axi_rn_id = 0;
    p_regs->sw03.dec_axi_wr_id = 0;
    p_regs->sw03.dec_mode = 8;

    return MPP_OK;
}